

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O1

optional<tinyusdz::Prim> * __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrimFromTypeName
          (optional<tinyusdz::Prim> *__return_storage_ptr__,Impl *this,string *typeName,
          string *primTypeName,string *prim_name,Node *node,Specifier spec,
          vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *primChildren,
          vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *properties,
          PathIndexToSpecIndexMap *psmap,PrimMeta *meta,bool *is_unsupported_prim)

{
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *pvVar1;
  bool *pbVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  GeomMesh *pGVar6;
  PrimMeta *pPVar7;
  ostream *poVar8;
  optional<tinyusdz::Prim> *poVar9;
  Prim prim;
  Scope typed_prim;
  storage_union local_4d40;
  undefined1 local_4d30 [32];
  Node *local_4d10;
  optional<tinyusdz::Prim> *local_4d08;
  string *local_4d00;
  undefined1 local_4cf8 [624];
  string local_4a88 [224];
  undefined1 local_49a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4998;
  undefined1 local_4988 [16];
  undefined1 local_4978 [112];
  string local_4908 [32];
  storage_t<double> local_48e8 [5];
  string local_48c0 [632];
  undefined1 local_4648 [784];
  undefined1 local_4338 [144];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_42a8;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_4290 [7];
  undefined1 local_41e8 [480];
  undefined1 local_4008 [40];
  undefined1 local_3fe0 [16];
  undefined1 local_3fd0 [16];
  undefined1 local_3fc0 [16];
  Specifier local_3fb0;
  undefined4 uStack_3fac;
  undefined8 local_3fa8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3fa0;
  undefined1 local_3f90 [16];
  undefined1 local_3f80 [32];
  undefined1 local_3f60 [24];
  undefined1 local_3f48 [24];
  undefined1 auStack_3f30 [16];
  undefined1 auStack_3f20 [24];
  undefined1 auStack_3f08 [16];
  undefined1 auStack_3ef8 [32];
  undefined1 local_3ed8 [24];
  undefined1 auStack_3ec0 [32];
  undefined1 local_3ea0 [16];
  undefined1 local_3e90 [24];
  undefined1 auStack_3e78 [16];
  undefined1 local_3e68 [16];
  undefined1 local_3e58 [16];
  undefined1 local_3e48 [32];
  undefined1 auStack_3e28 [16];
  undefined1 auStack_3e18 [16];
  undefined1 local_3e08 [16];
  undefined1 auStack_3df8 [8];
  undefined1 local_3df0 [24];
  undefined1 auStack_3dd8 [16];
  undefined1 local_3dc8 [16];
  undefined1 local_3db8 [24];
  undefined1 local_3da0 [16];
  undefined1 local_3d90 [24];
  undefined1 local_3d78 [16];
  undefined1 local_3d68 [16];
  undefined1 local_3d58 [16];
  undefined1 auStack_3d48 [16];
  undefined1 auStack_3d38 [16];
  undefined1 local_3d28 [16];
  undefined1 local_3d18 [16];
  undefined1 local_3d08 [24];
  undefined1 local_3cf0 [16];
  undefined1 local_3ce0 [16];
  undefined1 local_3cd0 [16];
  undefined1 auStack_3cc0 [24];
  undefined1 local_3ca8 [16];
  undefined1 auStack_3c98 [32];
  undefined1 local_3c78 [32];
  undefined1 local_3c58 [32];
  undefined1 local_3c38 [24];
  undefined1 auStack_3c20 [16];
  undefined1 auStack_3c10 [24];
  undefined1 auStack_3bf8 [24];
  undefined1 auStack_3be0 [24];
  undefined1 local_3bc8 [40];
  undefined1 auStack_3ba0 [40];
  undefined1 auStack_3b78 [24];
  undefined1 local_3b60 [32];
  undefined1 local_3b40 [32];
  undefined1 local_3b20 [8];
  undefined1 auStack_3b18 [16];
  undefined1 auStack_3b08 [24];
  storage_t<tinyusdz::value::StringData> local_3af0 [3];
  undefined1 local_3a58 [120];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_39e0 [12];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_38b8;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_38a0 [2];
  undefined1 local_3868 [544];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_3648 [19];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_3470;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_3458 [29];
  undefined1 local_31a0 [704];
  undefined1 local_2ee0 [336];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2d90 [12];
  undefined1 local_2c68 [224];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2b88 [6];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2ae8;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2ad0 [25];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2870;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2858 [428];
  
  pbVar2 = is_unsupported_prim;
  if (is_unsupported_prim != (bool *)0x0) {
    *is_unsupported_prim = false;
  }
  local_4d30._24_8_ = primTypeName;
  local_4d10 = node;
  iVar5 = ::std::__cxx11::string::compare((char *)typeName);
  local_4d08 = __return_storage_ptr__;
  if ((iVar5 == 0) || (iVar5 = ::std::__cxx11::string::compare((char *)typeName), iVar5 == 0)) {
    local_4978._0_8_ = local_4988;
    local_49a8._0_8_ = (pointer)0x0;
    local_49a8._8_8_ = (pointer)0x0;
    local_4998._M_allocated_capacity._0_4_ = 0;
    local_4998._M_local_buf[4] = '\0';
    local_4998._M_local_buf[5] = '\0';
    local_4998._M_local_buf[6] = '\0';
    local_4998._M_local_buf[7] = '\0';
    local_4988._0_4_ = _S_red;
    local_4988._8_8_ = (_Base_ptr)0x0;
    local_4978._16_8_ = 0;
    local_4978[0x18] = false;
    local_4d00 = typeName;
    local_4978._8_8_ = local_4978._0_8_;
    memset(local_4338,0,0x308);
    local_41e8._448_4_ = _S_red;
    local_41e8._456_8_ = (_Base_ptr)0x0;
    memset(local_4978 + 0x20,0,0x309);
    memset(local_4648,0,0x309);
    local_4008._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_4008._32_8_ = (long)local_4008 + 0x10;
    local_4008._16_4_ = _S_red;
    local_4008[0x18] = false;
    local_4008._25_3_ = 0;
    local_4008._28_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
    local_3fe0._8_8_ = 0;
    local_3fd0._0_8_ = local_3fc0;
    local_3fd0._8_8_ = 0;
    local_3fc0[0] = '\0';
    _local_3fb0 = &local_3fa0;
    local_3fa8 = (char *)0x0;
    local_3fa0._M_local_buf[0] = false;
    local_3f90._0_4_ = Def;
    local_3f90._8_8_ = (anon_struct_8_0_00000001_for___align)0xffffffffffffffff;
    local_3f80._8_4_ = 0;
    local_3f80._16_8_ = local_3f60;
    local_3f80._0_4_ = 0;
    local_3f80[4] = '\0';
    local_3f80._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3f60[0] = '\0';
    local_3f60[0x10] = 0;
    local_3e08[0] = 0;
    local_3ca8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3c98._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3c98._8_8_ = (_Base_ptr)0x0;
    auStack_3c98._16_8_ = (_Base_ptr)0x0;
    local_3c78._16_8_ = local_3c78;
    local_3c78._0_4_ = _S_red;
    local_3c78._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3f48._0_8_ = 0;
    local_3f48._8_8_ = 0;
    local_3f48._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3f30._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3f30._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3f20._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3f20[8] = '\0';
    auStack_3f20._16_8_ = 0;
    auStack_3f08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3f08._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3ef8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3ef8._8_8_ = 0;
    auStack_3ef8._16_8_ = 0;
    auStack_3ef8[0x18] = 0;
    local_3ed8._0_8_ = 0;
    local_3ed8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ed8._16_8_ = 0;
    auStack_3ec0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3ec0._8_8_ = 0;
    auStack_3ec0._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3ec0[0x18] = 0;
    auStack_3e78[8] = 0;
    local_3e90._16_8_ = 0;
    auStack_3e78._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e90._0_8_ = 0;
    local_3e90._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ea0._0_8_ = 0;
    local_3ea0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e48[0] = 0;
    local_3e58._0_8_ = 0;
    local_3e58._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e68._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e68._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3e28._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3e18._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e48._24_8_ = 0;
    auStack_3e28._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e48._8_8_ = 0;
    local_3e48._16_8_ = 0;
    auStack_3e18._8_2_ = 0;
    auStack_3dd8[8] = 0;
    local_3df0._16_8_ = 0;
    auStack_3dd8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3df0._0_8_ = 0;
    local_3df0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e08._8_8_ = 0;
    auStack_3df8 = (undefined1  [8])0x0;
    local_3db8[0x10] = 0;
    local_3db8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3db8._8_8_ = 0;
    local_3dc8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3dc8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d90[0x10] = 0;
    local_3d90._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d90._8_8_ = 0;
    local_3da0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3da0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d58[0] = 0;
    local_3d68._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d68._8_8_ = 0;
    local_3d78._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d78._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3d38[8] = 0;
    auStack_3d48._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3d38._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d58._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3d48._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d08[0x10] = 0;
    local_3d08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d08._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d18._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d18._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d28._0_8_ = 0;
    local_3d28._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3cd0[0] = 0;
    local_3ce0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ce0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3cf0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3cf0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ca8[0] = 0;
    auStack_3cc0._8_8_ = 0;
    auStack_3cc0._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3cd0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3cc0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3c58._0_8_ = (_Base_ptr)0x0;
    local_3c38._0_8_ = (long)local_3c58 + 0x10;
    local_3c58._16_4_ = _S_red;
    local_3c58._24_8_ = (_Base_ptr)0x0;
    auStack_3bf8[0] = 0;
    auStack_3bf8._1_8_ = 0;
    auStack_3c10._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3c10[0x10] = 0;
    auStack_3c10._17_7_ = 0;
    auStack_3c20._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3c10._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3c38._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3c20._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3bc8[0] = false;
    auStack_3be0._8_8_ = 0;
    auStack_3be0._16_8_ = 0;
    auStack_3bf8._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3be0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3bc8[0x18] = 0;
    local_3bc8._25_8_ = 0;
    local_3bc8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3bc8[0x10] = 0;
    local_3bc8._17_7_ = 0;
    local_3b60._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3b60._0_8_ = 0;
    local_3b60._8_8_ = (pointer)0x0;
    local_3b40._16_8_ = local_3b40;
    local_3b40._0_4_ = 0;
    local_3b40._8_8_ = 0;
    auStack_3ba0._16_4_ = 0;
    auStack_3ba0._20_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
    auStack_3ba0[0x18] = false;
    auStack_3ba0._25_3_ = 0;
    auStack_3ba0[0] = false;
    auStack_3ba0._1_3_ = 0;
    auStack_3ba0._4_4_ = (storage_t<unsigned_int>)0x0;
    auStack_3ba0._8_4_ = 0;
    auStack_3ba0._12_4_ = 0;
    auStack_3b78._8_4_ = 0;
    auStack_3b78._12_8_ = 0;
    auStack_3ba0._32_8_ = 0;
    auStack_3b78._0_4_ = 0;
    auStack_3b78._4_4_ = 0;
    local_3af0[0].data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3b08._8_8_ = 0;
    auStack_3b08._16_8_ = 0;
    auStack_3b18._8_8_ = (pointer)0x0;
    auStack_3b08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3b20 = (undefined1  [8])0x0;
    auStack_3b18._0_8_ = (storage_t<double>)0x0;
    local_41e8._464_8_ = (_Base_ptr)(local_41e8 + 0x1c0);
    local_41e8._472_8_ = (_Base_ptr)(local_41e8 + 0x1c0);
    local_3fe0._0_8_ = local_4008._32_8_;
    local_3c78._24_8_ = local_3c78._16_8_;
    local_3c38._8_8_ = local_3c38._0_8_;
    local_3b40._24_8_ = local_3b40._16_8_;
    bVar4 = ReconstructPrim<tinyusdz::Model>(this,&spec,local_4d10,psmap,(Model *)local_49a8);
    if (!bVar4) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
      poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x70b);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"Failed to reconstruct Model",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      goto LAB_0017d694;
    }
    PrimMetas::operator=((PrimMetas *)local_3f80,meta);
    ::std::__cxx11::string::_M_assign((string *)local_3fd0);
    iVar5 = ::std::__cxx11::string::compare((char *)local_4d00);
    poVar9 = local_4d08;
    if (iVar5 == 0) {
      ::std::__cxx11::string::_M_replace((ulong)&local_3fb0,0,(char *)local_3fa8,0x3c5b84);
    }
    else {
      ::std::__cxx11::string::_M_assign((string *)&local_3fb0);
    }
    local_3f90._0_4_ = spec;
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(auStack_3b08 + 8),
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
    pvVar1 = primChildren;
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)auStack_3b18,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
    local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::Model>()::table;
    pGVar6 = (GeomMesh *)operator_new(0xec0);
    Model::Model((Model *)pGVar6,(Model *)local_49a8);
    local_4d40.dynamic = pGVar6;
    Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d40);
    ::std::__cxx11::string::_M_assign(local_4a88);
    pPVar7 = Prim::metas((Prim *)local_4cf8);
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar7->primChildren,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
  }
  else {
    local_4998._M_allocated_capacity._0_4_ = 0x726f6658;
    local_4998._M_local_buf[4] = 'm';
    local_4998._M_local_buf[5] = '\0';
    local_49a8._8_8_ = (pointer)0x5;
    if ((typeName->_M_string_length == 5) &&
       (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,5),
       iVar5 == 0)) {
      GPrim::GPrim((GPrim *)local_49a8);
      bVar4 = ReconstructPrim<tinyusdz::Xform>(this,&spec,local_4d10,psmap,(Xform *)local_49a8);
      if (bVar4) {
        PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
        ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
        auStack_3f20._16_4_ = spec;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (local_2b88,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
        pvVar1 = primChildren;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200),
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
        local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::Xform>()::table;
        pGVar6 = (GeomMesh *)operator_new(0x1e68);
        GPrim::GPrim((GPrim *)pGVar6,(GPrim *)local_49a8);
        local_4d40.dynamic = pGVar6;
        Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d40);
        ::std::__cxx11::string::_M_assign(local_4a88);
        pPVar7 = Prim::metas((Prim *)local_4cf8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                   &pPVar7->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        __return_storage_ptr__->has_value_ = true;
        Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
          (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
          local_4d30._0_8_ = (pointer)0x0;
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
        poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x720);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
        poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                            typeName->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
        poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(prim_name->_M_dataplus)._M_p,prim_name->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_4d40);
        if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
          operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      GPrim::~GPrim((GPrim *)local_49a8);
      return __return_storage_ptr__;
    }
    local_4998._M_allocated_capacity._0_4_ = 0x65646f4d;
    local_4998._M_local_buf[4] = 'l';
    local_4998._M_local_buf[5] = '\0';
    local_49a8._8_8_ = (pointer)0x5;
    local_4d30._16_8_ = prim_name;
    if ((typeName->_M_string_length != 5) ||
       (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,5),
       iVar5 != 0)) {
      local_4998._M_allocated_capacity._0_4_ = 0x706f6353;
      local_4998._M_local_buf[4] = 'e';
      local_4998._M_local_buf[5] = '\0';
      local_49a8._8_8_ = (pointer)0x5;
      if ((typeName->_M_string_length == 5) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,5),
         iVar5 == 0)) {
        Scope::Scope((Scope *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::Scope>(this,&spec,local_4d10,psmap,(Scope *)local_49a8);
        uVar3 = local_4d30._16_8_;
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)&local_3fa0,meta);
          ::std::__cxx11::string::_M_assign((string *)local_3fd0);
          local_3fb0 = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_38a0,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_38b8,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::Scope>()::table;
          pGVar6 = (GeomMesh *)operator_new(0x1120);
          Scope::Scope((Scope *)pGVar6,(Scope *)local_49a8);
          local_4d40.dynamic = pGVar6;
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x722);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)uVar3,
                              (long)(((string *)(uVar3 + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        Scope::~Scope((Scope *)local_49a8);
        return __return_storage_ptr__;
      }
      uVar3 = local_4d30._16_8_;
      local_4998._M_allocated_capacity._0_4_ = 0x6873654d;
      local_49a8._8_8_ = (pointer)0x4;
      local_4998._M_local_buf[4] = '\0';
      if ((typeName->_M_string_length == 4) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,4),
         iVar5 == 0)) {
        GeomMesh::GeomMesh((GeomMesh *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::GeomMesh>
                          (this,&spec,local_4d10,psmap,(GeomMesh *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
          auStack_3f20._16_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomMesh>()::table;
          pGVar6 = (GeomMesh *)operator_new(0x4978);
          GeomMesh::GeomMesh(pGVar6,(GeomMesh *)local_49a8);
          local_4d40.dynamic = pGVar6;
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x723);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)uVar3,
                              (long)(((string *)(uVar3 + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomMesh::~GeomMesh((GeomMesh *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x6e696f50;
      local_4998._M_local_buf[4] = 't';
      local_4998._M_local_buf[5] = 's';
      local_49a8._8_8_ = (pointer)0x6;
      local_4998._M_local_buf[6] = '\0';
      if ((typeName->_M_string_length == 6) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,6),
         iVar5 == 0)) {
        GeomPoints::GeomPoints((GeomPoints *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::GeomPoints>
                          (this,&spec,local_4d10,psmap,(GeomPoints *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
          auStack_3f20._16_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomPoints>()::table;
          pGVar6 = (GeomMesh *)operator_new(0x2d38);
          GeomPoints::GeomPoints((GeomPoints *)pGVar6,(GeomPoints *)local_49a8);
          local_4d40.dynamic = pGVar6;
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x724);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)uVar3,
                              (long)(((string *)(uVar3 + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomPoints::~GeomPoints((GeomPoints *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x696c7943;
      local_4998._M_local_buf[4] = 'n';
      local_4998._M_local_buf[5] = 'd';
      local_4998._M_local_buf[6] = 'e';
      local_4998._M_local_buf[7] = 'r';
      local_49a8._8_8_ = (pointer)0x8;
      local_4998._M_local_buf[8] = '\0';
      if ((typeName->_M_string_length == 8) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,8),
         iVar5 == 0)) {
        GeomCylinder::GeomCylinder((GeomCylinder *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::GeomCylinder>
                          (this,&spec,local_4d10,psmap,(GeomCylinder *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          uVar3 = local_4d30._16_8_;
          ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
          auStack_3f20._16_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomCylinder>()::table;
          pGVar6 = (GeomMesh *)operator_new(0x25d0);
          GeomCylinder::GeomCylinder((GeomCylinder *)pGVar6,(GeomCylinder *)local_49a8);
          local_4d40.dynamic = pGVar6;
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x725);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)local_4d30._16_8_,
                              (long)(((string *)(local_4d30._16_8_ + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomCylinder::~GeomCylinder((GeomCylinder *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x65627543;
      local_49a8._8_8_ = (pointer)0x4;
      local_4998._M_local_buf[4] = '\0';
      if ((typeName->_M_string_length == 4) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,4),
         iVar5 == 0)) {
        GeomCube::GeomCube((GeomCube *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::GeomCube>
                          (this,&spec,local_4d10,psmap,(GeomCube *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          uVar3 = local_4d30._16_8_;
          ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
          auStack_3f20._16_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomCube>()::table;
          linb::any::do_construct<tinyusdz::GeomCube_const&,tinyusdz::GeomCube>
                    ((any *)&local_4d40,(GeomCube *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x726);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)local_4d30._16_8_,
                              (long)(((string *)(local_4d30._16_8_ + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomCube::~GeomCube((GeomCube *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x656e6f43;
      local_49a8._8_8_ = (pointer)0x4;
      local_4998._M_local_buf[4] = '\0';
      if ((typeName->_M_string_length == 4) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,4),
         iVar5 == 0)) {
        GeomCone::GeomCone((GeomCone *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::GeomCone>
                          (this,&spec,local_4d10,psmap,(GeomCone *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          uVar3 = local_4d30._16_8_;
          ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
          auStack_3f20._16_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomCone>()::table;
          pGVar6 = (GeomMesh *)operator_new(0x25d0);
          GeomCone::GeomCone((GeomCone *)pGVar6,(GeomCone *)local_49a8);
          local_4d40.dynamic = pGVar6;
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x727);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)local_4d30._16_8_,
                              (long)(((string *)(local_4d30._16_8_ + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomCone::~GeomCone((GeomCone *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x65687053;
      local_4998._M_local_buf[4] = 'r';
      local_4998._M_local_buf[5] = 'e';
      local_49a8._8_8_ = (pointer)0x6;
      local_4998._M_local_buf[6] = '\0';
      if ((typeName->_M_string_length == 6) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,6),
         iVar5 == 0)) {
        GeomSphere::GeomSphere((GeomSphere *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::GeomSphere>
                          (this,&spec,local_4d10,psmap,(GeomSphere *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          uVar3 = local_4d30._16_8_;
          ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
          auStack_3f20._16_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomSphere>()::table;
          linb::any::do_construct<tinyusdz::GeomSphere_const&,tinyusdz::GeomSphere>
                    ((any *)&local_4d40,(GeomSphere *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x728);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)local_4d30._16_8_,
                              (long)(((string *)(local_4d30._16_8_ + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomSphere::~GeomSphere((GeomSphere *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x73706143;
      local_4998._M_local_buf[4] = 'u';
      local_4998._M_local_buf[5] = 'l';
      local_4998._M_local_buf[6] = 'e';
      local_49a8._8_8_ = (pointer)0x7;
      local_4998._M_local_buf[7] = '\0';
      if ((typeName->_M_string_length == 7) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,7),
         iVar5 == 0)) {
        GeomCapsule::GeomCapsule((GeomCapsule *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::GeomCapsule>
                          (this,&spec,local_4d10,psmap,(GeomCapsule *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          uVar3 = local_4d30._16_8_;
          ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
          auStack_3f20._16_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomCapsule>()::table;
          pGVar6 = (GeomMesh *)operator_new(0x25d0);
          GeomCapsule::GeomCapsule((GeomCapsule *)pGVar6,(GeomCapsule *)local_49a8);
          local_4d40.dynamic = pGVar6;
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x729);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)local_4d30._16_8_,
                              (long)(((string *)(local_4d30._16_8_ + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomCapsule::~GeomCapsule((GeomCapsule *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x69736142;
      local_4998._M_local_buf[4] = 's';
      local_4998._M_local_buf[5] = 'C';
      local_4998._M_local_buf[6] = 'u';
      local_4998._M_local_buf[7] = 'r';
      local_4998._M_local_buf[8] = 'v';
      local_4998._M_local_buf[9] = 'e';
      local_4998._M_local_buf[10] = 's';
      local_49a8._8_8_ = (pointer)0xb;
      local_4998._M_local_buf[0xb] = '\0';
      if ((typeName->_M_string_length == 0xb) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,0xb)
         , iVar5 == 0)) {
        GeomBasisCurves::GeomBasisCurves((GeomBasisCurves *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::GeomBasisCurves>
                          (this,&spec,local_4d10,psmap,(GeomBasisCurves *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          uVar3 = local_4d30._16_8_;
          ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
          auStack_3f20._16_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomBasisCurves>()::table;
          pGVar6 = (GeomMesh *)operator_new(0x33e0);
          GeomBasisCurves::GeomBasisCurves((GeomBasisCurves *)pGVar6,(GeomBasisCurves *)local_49a8);
          local_4d40.dynamic = pGVar6;
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x72a);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)local_4d30._16_8_,
                              (long)(((string *)(local_4d30._16_8_ + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomBasisCurves::~GeomBasisCurves((GeomBasisCurves *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x6272754e;
      local_4998._M_local_buf[4] = 's';
      local_4998._M_local_buf[5] = 'C';
      local_4998._M_local_buf[6] = 'u';
      local_4998._M_local_buf[7] = 'r';
      local_4998._M_local_buf[8] = 'v';
      local_4998._M_local_buf[9] = 'e';
      local_4998._M_local_buf[10] = 's';
      local_49a8._8_8_ = (pointer)0xb;
      local_4998._M_local_buf[0xb] = '\0';
      if ((typeName->_M_string_length == 0xb) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,0xb)
         , iVar5 == 0)) {
        GeomNurbsCurves::GeomNurbsCurves((GeomNurbsCurves *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::GeomNurbsCurves>
                          (this,&spec,local_4d10,psmap,(GeomNurbsCurves *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          uVar3 = local_4d30._16_8_;
          ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
          auStack_3f20._16_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomNurbsCurves>()::table;
          pGVar6 = (GeomMesh *)operator_new(0x3718);
          GeomNurbsCurves::GeomNurbsCurves((GeomNurbsCurves *)pGVar6,(GeomNurbsCurves *)local_49a8);
          local_4d40.dynamic = pGVar6;
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x72b);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)local_4d30._16_8_,
                              (long)(((string *)(local_4d30._16_8_ + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomNurbsCurves::~GeomNurbsCurves((GeomNurbsCurves *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x6e696f50;
      local_4998._M_local_buf[4] = 't';
      local_4998._M_local_buf[5] = 'I';
      local_4998._M_local_buf[6] = 'n';
      local_4998._M_local_buf[7] = 's';
      local_4998._M_local_buf[8] = 't';
      local_4998._M_local_buf[9] = 'a';
      local_4998._M_local_buf[10] = 'n';
      local_4998._M_local_buf[0xb] = 'c';
      local_4998._M_local_buf[0xc] = 'e';
      local_4998._M_local_buf[0xd] = 'r';
      local_49a8._8_8_ = (pointer)0xe;
      local_4998._M_local_buf[0xe] = '\0';
      if ((typeName->_M_string_length == 0xe) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,0xe)
         , iVar5 == 0)) {
        PointInstancer::PointInstancer((PointInstancer *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::PointInstancer>
                          (this,&spec,local_4d10,psmap,(PointInstancer *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          uVar3 = local_4d30._16_8_;
          ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
          auStack_3f20._16_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::PointInstancer>()::table;
          pGVar6 = (GeomMesh *)operator_new(0x37b0);
          PointInstancer::PointInstancer((PointInstancer *)pGVar6,(PointInstancer *)local_49a8);
          local_4d40.dynamic = pGVar6;
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x72c);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)local_4d30._16_8_,
                              (long)(((string *)(local_4d30._16_8_ + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        PointInstancer::~PointInstancer((PointInstancer *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x656d6143;
      local_4998._M_local_buf[4] = 'r';
      local_4998._M_local_buf[5] = 'a';
      local_49a8._8_8_ = (pointer)0x6;
      local_4998._M_local_buf[6] = '\0';
      if ((typeName->_M_string_length == 6) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,6),
         iVar5 == 0)) {
        GeomCamera::GeomCamera((GeomCamera *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::GeomCamera>
                          (this,&spec,local_4d10,psmap,(GeomCamera *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          uVar3 = local_4d30._16_8_;
          ::std::__cxx11::string::_M_assign((string *)auStack_3f30);
          auStack_3f20._16_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomCamera>()::table;
          pGVar6 = (GeomMesh *)operator_new(0x41a8);
          GeomCamera::GeomCamera((GeomCamera *)pGVar6,(GeomCamera *)local_49a8);
          local_4d40.dynamic = pGVar6;
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x72d);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)local_4d30._16_8_,
                              (long)(((string *)(local_4d30._16_8_ + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomCamera::~GeomCamera((GeomCamera *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x6d6f6547;
      local_4998._M_local_buf[4] = 'S';
      local_4998._M_local_buf[5] = 'u';
      local_4998._M_local_buf[6] = 'b';
      local_4998._M_local_buf[7] = 's';
      local_4998._M_local_buf[8] = 'e';
      local_4998._M_local_buf[9] = 't';
      local_49a8._8_8_ = (pointer)0xa;
      local_4998._M_local_buf[10] = '\0';
      if ((typeName->_M_string_length == 10) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,10),
         iVar5 == 0)) {
        GeomSubset::GeomSubset((GeomSubset *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::GeomSubset>
                          (this,&spec,local_4d10,psmap,(GeomSubset *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)local_3868,meta);
          uVar3 = local_4d30._16_8_;
          ::std::__cxx11::string::_M_assign((string *)local_3fd0);
          local_3fb0 = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_3458,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_3470,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::GeomSubset>()::table;
          pGVar6 = (GeomMesh *)operator_new(0x1568);
          GeomSubset::GeomSubset((GeomSubset *)pGVar6,(GeomSubset *)local_49a8);
          local_4d40.dynamic = pGVar6;
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x72e);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)local_4d30._16_8_,
                              (long)(((string *)(local_4d30._16_8_ + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomSubset::~GeomSubset((GeomSubset *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x65687053;
      local_4998._M_local_buf[4] = 'r';
      local_4998._M_local_buf[5] = 'e';
      local_4998._M_local_buf[6] = 'L';
      local_4998._M_local_buf[7] = 'i';
      local_4998._M_local_buf[8] = 'g';
      local_4998._M_local_buf[9] = 'h';
      local_4998._M_local_buf[10] = 't';
      local_49a8._8_8_ = (pointer)0xb;
      local_4998._M_local_buf[0xb] = '\0';
      if ((typeName->_M_string_length == 0xb) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,0xb)
         , iVar5 == 0)) {
        SphereLight::SphereLight((SphereLight *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::SphereLight>
                          (this,&spec,local_4d10,psmap,(SphereLight *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)local_2c68,meta);
          uVar3 = local_4d30._16_8_;
          ::std::__cxx11::string::_M_assign(local_48c0);
          local_48c0[0x20] = (string)(undefined1)spec;
          local_48c0[0x21] = (string)spec._1_1_;
          local_48c0[0x22] = (string)spec._2_1_;
          local_48c0[0x23] = (string)spec._3_1_;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2858,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_2870,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::SphereLight>()::table;
          linb::any::do_construct<tinyusdz::SphereLight_const&,tinyusdz::SphereLight>
                    ((any *)&local_4d40,(SphereLight *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x72f);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)local_4d30._16_8_,
                              (long)(((string *)(local_4d30._16_8_ + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        SphereLight::~SphereLight((SphereLight *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x656d6f44;
      local_4998._M_local_buf[4] = 'L';
      local_4998._M_local_buf[5] = 'i';
      local_4998._M_local_buf[6] = 'g';
      local_4998._M_local_buf[7] = 'h';
      local_4998._M_local_buf[8] = 't';
      local_4998._M_local_buf[9] = '\0';
      local_49a8._8_8_ = (pointer)0x9;
      if ((typeName->_M_string_length == 9) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,9),
         iVar5 == 0)) {
        DomeLight::DomeLight((DomeLight *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::DomeLight>
                          (this,&spec,local_4d10,psmap,(DomeLight *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)local_2ee0,meta);
          uVar3 = local_4d30._16_8_;
          ::std::__cxx11::string::_M_assign(local_48c0);
          local_48c0[0x20] = (string)(undefined1)spec;
          local_48c0[0x21] = (string)spec._1_1_;
          local_48c0[0x22] = (string)spec._2_1_;
          local_48c0[0x23] = (string)spec._3_1_;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2ad0,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_2ae8,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::DomeLight>()::table;
          pGVar6 = (GeomMesh *)operator_new(0x26a0);
          DomeLight::DomeLight((DomeLight *)pGVar6,(DomeLight *)local_49a8);
          local_4d40.dynamic = pGVar6;
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x730);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)local_4d30._16_8_,
                              (long)(((string *)(local_4d30._16_8_ + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        DomeLight::~DomeLight((DomeLight *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x696c7943;
      local_4998._M_local_buf[4] = 'n';
      local_4998._M_local_buf[5] = 'd';
      local_4998._M_local_buf[6] = 'e';
      local_4998._M_local_buf[7] = 'r';
      local_4998._M_local_buf[8] = 'L';
      local_4998._M_local_buf[9] = 'i';
      local_4998._M_local_buf[10] = 'g';
      local_4998._M_local_buf[0xb] = 'h';
      local_4998._M_local_buf[0xc] = 't';
      local_49a8._8_8_ = (pointer)0xd;
      local_4998._M_local_buf[0xd] = '\0';
      if ((typeName->_M_string_length == 0xd) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,0xd)
         , uVar3 = local_4d30._16_8_, iVar5 == 0)) {
        CylinderLight::CylinderLight((CylinderLight *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::CylinderLight>
                          (this,&spec,local_4d10,psmap,(CylinderLight *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)local_2c68,meta);
          ::std::__cxx11::string::_M_assign(local_48c0);
          local_48c0[0x20] = (string)(undefined1)spec;
          local_48c0[0x21] = (string)spec._1_1_;
          local_48c0[0x22] = (string)spec._2_1_;
          local_48c0[0x23] = (string)spec._3_1_;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2858,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_2870,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::CylinderLight>()::table;
          pGVar6 = (GeomMesh *)operator_new(0x2678);
          CylinderLight::CylinderLight((CylinderLight *)pGVar6,(CylinderLight *)local_49a8);
          local_4d40.dynamic = pGVar6;
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x731);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)uVar3,
                              (long)(((string *)(uVar3 + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        CylinderLight::~CylinderLight((CylinderLight *)local_49a8);
        return __return_storage_ptr__;
      }
      uVar3 = local_4d30._16_8_;
      local_4998._M_allocated_capacity._0_4_ = 0x6b736944;
      local_4998._M_local_buf[4] = 'L';
      local_4998._M_local_buf[5] = 'i';
      local_4998._M_local_buf[6] = 'g';
      local_4998._M_local_buf[7] = 'h';
      local_4998._M_local_buf[8] = 't';
      local_4998._M_local_buf[9] = '\0';
      local_49a8._8_8_ = (pointer)0x9;
      if ((typeName->_M_string_length == 9) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,9),
         iVar5 == 0)) {
        DiskLight::DiskLight((DiskLight *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::DiskLight>
                          (this,&spec,local_4d10,psmap,(DiskLight *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)local_2c68,meta);
          ::std::__cxx11::string::_M_assign(local_48c0);
          local_48c0[0x20] = (string)(undefined1)spec;
          local_48c0[0x21] = (string)spec._1_1_;
          local_48c0[0x22] = (string)spec._2_1_;
          local_48c0[0x23] = (string)spec._3_1_;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2858,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_2870,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::DiskLight>()::table;
          linb::any::do_construct<tinyusdz::DiskLight_const&,tinyusdz::DiskLight>
                    ((any *)&local_4d40,(DiskLight *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x732);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)uVar3,
                              (long)(((string *)(uVar3 + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        DiskLight::~DiskLight((DiskLight *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x74736944;
      local_4998._M_local_buf[4] = 'a';
      local_4998._M_local_buf[5] = 'n';
      local_4998._M_local_buf[6] = 't';
      local_4998._M_local_buf[7] = 'L';
      local_4998._M_local_buf[8] = 'i';
      local_4998._M_local_buf[9] = 'g';
      local_4998._M_local_buf[10] = 'h';
      local_4998._M_local_buf[0xb] = 't';
      local_49a8._8_8_ = (pointer)0xc;
      local_4998._M_local_buf[0xc] = '\0';
      if ((typeName->_M_string_length == 0xc) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,0xc)
         , iVar5 == 0)) {
        DistantLight::DistantLight((DistantLight *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::DistantLight>
                          (this,&spec,local_4d10,psmap,(DistantLight *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)local_2ee0,meta);
          ::std::__cxx11::string::_M_assign(local_48c0);
          local_48c0[0x20] = (string)(undefined1)spec;
          local_48c0[0x21] = (string)spec._1_1_;
          local_48c0[0x22] = (string)spec._2_1_;
          local_48c0[0x23] = (string)spec._3_1_;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2ad0,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_2ae8,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::DistantLight>()::table;
          linb::any::do_construct<tinyusdz::DistantLight_const&,tinyusdz::DistantLight>
                    ((any *)&local_4d40,(DistantLight *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x733);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)uVar3,
                              (long)(((string *)(uVar3 + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        DistantLight::~DistantLight((DistantLight *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x6c656b53;
      local_4998._M_local_buf[4] = 'R';
      local_4998._M_local_buf[5] = 'o';
      local_4998._M_local_buf[6] = 'o';
      local_4998._M_local_buf[7] = 't';
      local_49a8._8_8_ = (pointer)0x8;
      local_4998._M_local_buf[8] = '\0';
      if ((typeName->_M_string_length == 8) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,8),
         iVar5 == 0)) {
        SkelRoot::SkelRoot((SkelRoot *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::SkelRoot>
                          (this,&spec,local_4d10,psmap,(SkelRoot *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)local_3df0,meta);
          ::std::__cxx11::string::_M_assign(local_4908);
          local_48e8[0]._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_39e0,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     (local_3a58 + 0x60),
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::SkelRoot>()::table;
          pGVar6 = (GeomMesh *)operator_new(0xfe0);
          SkelRoot::SkelRoot((SkelRoot *)pGVar6,(SkelRoot *)local_49a8);
          local_4d40.dynamic = pGVar6;
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x734);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)uVar3,
                              (long)(((string *)(uVar3 + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        SkelRoot::~SkelRoot((SkelRoot *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x6c656b53;
      local_4998._M_local_buf[4] = 'e';
      local_4998._M_local_buf[5] = 't';
      local_4998._M_local_buf[6] = 'o';
      local_4998._M_local_buf[7] = 'n';
      local_49a8._8_8_ = (pointer)0x8;
      local_4998._M_local_buf[8] = '\0';
      if ((typeName->_M_string_length == 8) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,8),
         iVar5 == 0)) {
        Skeleton::Skeleton((Skeleton *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::Skeleton>
                          (this,&spec,local_4d10,psmap,(Skeleton *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)local_31a0,meta);
          ::std::__cxx11::string::_M_assign(local_4908);
          local_48e8[0]._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2d90,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     (local_2ee0 + 0x138),
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::Skeleton>()::table;
          pGVar6 = (GeomMesh *)operator_new(0x1c30);
          Skeleton::Skeleton((Skeleton *)pGVar6,(Skeleton *)local_49a8);
          local_4d40.dynamic = pGVar6;
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x735);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)uVar3,
                              (long)(((string *)(uVar3 + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        Skeleton::~Skeleton((Skeleton *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x6c656b53;
      local_4998._M_local_buf[4] = 'A';
      local_4998._M_local_buf[5] = 'n';
      local_4998._M_local_buf[6] = 'i';
      local_4998._M_local_buf[7] = 'm';
      local_4998._M_local_buf[8] = 'a';
      local_4998._M_local_buf[9] = 't';
      local_4998._M_local_buf[10] = 'i';
      local_4998._M_local_buf[0xb] = 'o';
      local_4998._M_local_buf[0xc] = 'n';
      local_49a8._8_8_ = (pointer)0xd;
      local_4998._M_local_buf[0xd] = '\0';
      if ((typeName->_M_string_length == 0xd) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,0xd)
         , iVar5 == 0)) {
        SkelAnimation::SkelAnimation((SkelAnimation *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::SkelAnimation>
                          (this,&spec,local_4d10,psmap,(SkelAnimation *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)local_3a58,meta);
          ::std::__cxx11::string::_M_assign((string *)local_49a8);
          local_4988._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_3648,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     (local_3868 + 0x208),
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::SkelAnimation>()::table;
          pGVar6 = (GeomMesh *)operator_new(0x1378);
          SkelAnimation::SkelAnimation((SkelAnimation *)pGVar6,(SkelAnimation *)local_49a8);
          local_4d40.dynamic = pGVar6;
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x736);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)uVar3,
                              (long)(((string *)(uVar3 + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        SkelAnimation::~SkelAnimation((SkelAnimation *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x6e656c42;
      local_4998._M_local_buf[4] = 'd';
      local_4998._M_local_buf[5] = 'S';
      local_4998._M_local_buf[6] = 'h';
      local_4998._M_local_buf[7] = 'a';
      local_4998._M_local_buf[8] = 'p';
      local_4998._M_local_buf[9] = 'e';
      local_49a8._8_8_ = (pointer)0xa;
      local_4998._M_local_buf[10] = '\0';
      if ((typeName->_M_string_length == 10) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,10),
         iVar5 == 0)) {
        BlendShape::BlendShape((BlendShape *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::BlendShape>
                          (this,&spec,local_4d10,psmap,(BlendShape *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)local_41e8,meta);
          ::std::__cxx11::string::_M_assign((string *)local_49a8);
          local_4988._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)auStack_3dd8,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_3df0,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::BlendShape>()::table;
          pGVar6 = (GeomMesh *)operator_new(0xbe8);
          BlendShape::BlendShape((BlendShape *)pGVar6,(BlendShape *)local_49a8);
          local_4d40.dynamic = pGVar6;
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x737);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)uVar3,
                              (long)(((string *)(uVar3 + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        BlendShape::~BlendShape((BlendShape *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x64616853;
      local_4998._M_local_buf[4] = 'e';
      local_4998._M_local_buf[5] = 'r';
      local_49a8._8_8_ = (pointer)0x6;
      local_4998._M_local_buf[6] = '\0';
      if ((typeName->_M_string_length == 6) &&
         (local_49a8._0_8_ = &local_4998, iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,6),
         iVar5 == 0)) {
        Shader::Shader((Shader *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::Shader>(this,&spec,local_4d10,psmap,(Shader *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)local_4978,meta);
          ::std::__cxx11::string::_M_assign((string *)local_49a8);
          local_4988._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_4290,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_42a8,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::Shader>()::table;
          linb::any::do_construct<tinyusdz::Shader_const&,tinyusdz::Shader>
                    ((any *)&local_4d40,(Shader *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x738);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)uVar3,
                              (long)(((string *)(uVar3 + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        Shader::~Shader((Shader *)local_49a8);
        return __return_storage_ptr__;
      }
      local_4998._M_allocated_capacity._0_4_ = 0x6574614d;
      local_4998._M_local_buf[4] = 'r';
      local_4998._M_local_buf[5] = 'i';
      local_4998._M_local_buf[6] = 'a';
      local_4998._M_local_buf[7] = 'l';
      local_49a8._8_8_ = (pointer)0x8;
      local_4998._M_local_buf[8] = '\0';
      local_49a8._0_8_ = &local_4998;
      if ((typeName->_M_string_length == 8) &&
         (iVar5 = bcmp((typeName->_M_dataplus)._M_p,&local_4998,8), iVar5 == 0)) {
        Material::Material((Material *)local_49a8);
        bVar4 = ReconstructPrim<tinyusdz::Material>
                          (this,&spec,local_4d10,psmap,(Material *)local_49a8);
        if (bVar4) {
          PrimMetas::operator=((PrimMetas *)local_4978,meta);
          ::std::__cxx11::string::_M_assign((string *)local_49a8);
          local_4988._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_4290,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_42a8,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::Material>()::table;
          linb::any::do_construct<tinyusdz::Material_const&,tinyusdz::Material>
                    ((any *)&local_4d40,(Material *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
          ::std::__cxx11::string::_M_assign(local_4a88);
          pPVar7 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar7->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          __return_storage_ptr__->has_value_ = true;
          Prim::Prim((Prim *)&__return_storage_ptr__->contained,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
            (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
            local_4d30._0_8_ = (pointer)0x0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x739);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                              typeName->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)uVar3,
                              (long)(((string *)(uVar3 + 8))->_M_dataplus)._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_4d40);
          if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
            operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        Material::~Material((Material *)local_49a8);
        return __return_storage_ptr__;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_49a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_49a8,"[warn]",6);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_49a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_49a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_49a8,"ReconstructPrimFromTypeName",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_49a8,"():",3);
      poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_49a8,0x73a);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_49a8,"TODO or unsupported prim type: ",0x1f);
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_49a8,(typeName->_M_dataplus)._M_p,
                          typeName->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushWarn(this,(string *)local_4cf8);
      if ((undefined1 *)local_4cf8._0_8_ != local_4cf8 + 0x10) {
        operator_delete((void *)local_4cf8._0_8_,local_4cf8._16_8_ + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_49a8);
      ::std::ios_base::~ios_base((ios_base *)(local_4978 + 0x40));
      if (pbVar2 != (bool *)0x0) {
        *pbVar2 = true;
      }
      __return_storage_ptr__->has_value_ = false;
      memset(&__return_storage_ptr__->contained,0,0x350);
      return __return_storage_ptr__;
    }
    local_4978._0_8_ = local_4988;
    local_49a8._0_8_ = (pointer)0x0;
    local_49a8._8_8_ = (pointer)0x0;
    local_4998._M_allocated_capacity._0_4_ = 0;
    local_4998._M_local_buf[4] = '\0';
    local_4998._M_local_buf[5] = '\0';
    local_4998._M_local_buf[6] = '\0';
    local_4998._M_local_buf[7] = '\0';
    local_4988._0_4_ = _S_red;
    local_4988._8_8_ = (_Base_ptr)0x0;
    local_4978._16_8_ = 0;
    local_4978[0x18] = false;
    local_4978._8_8_ = local_4978._0_8_;
    memset(local_4338,0,0x308);
    local_41e8._448_4_ = _S_red;
    local_41e8._456_8_ = (_Base_ptr)0x0;
    memset(local_4978 + 0x20,0,0x309);
    memset(local_4648,0,0x309);
    local_4008._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_4008._32_8_ = (long)local_4008 + 0x10;
    local_4008._16_4_ = _S_red;
    local_4008[0x18] = false;
    local_4008._25_3_ = 0;
    local_4008._28_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
    local_3fe0._8_8_ = 0;
    local_3fd0._0_8_ = local_3fc0;
    local_3fd0._8_8_ = 0;
    local_3fc0[0] = '\0';
    _local_3fb0 = &local_3fa0;
    local_3fa8 = (char *)0x0;
    local_3fa0._M_local_buf[0] = false;
    local_3f90._0_4_ = Def;
    local_3f90._8_8_ = (anon_struct_8_0_00000001_for___align)0xffffffffffffffff;
    local_3f80._8_4_ = 0;
    local_3f80._16_8_ = local_3f60;
    local_3f80._0_4_ = 0;
    local_3f80[4] = '\0';
    local_3f80._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3f60[0] = '\0';
    local_3f60[0x10] = 0;
    local_3e08[0] = 0;
    local_3ca8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3c98._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3c98._8_8_ = (_Base_ptr)0x0;
    auStack_3c98._16_8_ = (_Base_ptr)0x0;
    local_3c78._16_8_ = local_3c78;
    local_3c78._0_4_ = _S_red;
    local_3c78._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3f48._0_8_ = 0;
    local_3f48._8_8_ = 0;
    local_3f48._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3f30._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3f30._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3f20._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3f20[8] = '\0';
    auStack_3f20._16_8_ = 0;
    auStack_3f08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3f08._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3ef8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3ef8._8_8_ = 0;
    auStack_3ef8._16_8_ = 0;
    auStack_3ef8[0x18] = 0;
    local_3ed8._0_8_ = 0;
    local_3ed8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ed8._16_8_ = 0;
    auStack_3ec0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3ec0._8_8_ = 0;
    auStack_3ec0._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3ec0[0x18] = 0;
    auStack_3e78[8] = 0;
    local_3e90._16_8_ = 0;
    auStack_3e78._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e90._0_8_ = 0;
    local_3e90._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ea0._0_8_ = 0;
    local_3ea0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e48[0] = 0;
    local_3e58._0_8_ = 0;
    local_3e58._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e68._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e68._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3e28._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3e18._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e48._24_8_ = 0;
    auStack_3e28._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e48._8_8_ = 0;
    local_3e48._16_8_ = 0;
    auStack_3e18._8_2_ = 0;
    auStack_3dd8[8] = 0;
    local_3df0._16_8_ = 0;
    auStack_3dd8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3df0._0_8_ = 0;
    local_3df0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3e08._8_8_ = 0;
    auStack_3df8 = (undefined1  [8])0x0;
    local_3db8[0x10] = 0;
    local_3db8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3db8._8_8_ = 0;
    local_3dc8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3dc8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d90[0x10] = 0;
    local_3d90._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d90._8_8_ = 0;
    local_3da0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3da0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d58[0] = 0;
    local_3d68._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d68._8_8_ = 0;
    local_3d78._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d78._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3d38[8] = 0;
    auStack_3d48._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3d38._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d58._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3d48._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d08[0x10] = 0;
    local_3d08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d08._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d18._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d18._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3d28._0_8_ = 0;
    local_3d28._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3cd0[0] = 0;
    local_3ce0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ce0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3cf0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3cf0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3ca8[0] = 0;
    auStack_3cc0._8_8_ = 0;
    auStack_3cc0._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3cd0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3cc0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3c58._0_8_ = (_Base_ptr)0x0;
    local_3c38._0_8_ = (long)local_3c58 + 0x10;
    local_3c58._16_4_ = _S_red;
    local_3c58._24_8_ = (_Base_ptr)0x0;
    auStack_3bf8[0] = 0;
    auStack_3bf8._1_8_ = 0;
    auStack_3c10._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3c10[0x10] = 0;
    auStack_3c10._17_7_ = 0;
    auStack_3c20._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3c10._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3c38._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3c20._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3bc8[0] = false;
    auStack_3be0._8_8_ = 0;
    auStack_3be0._16_8_ = 0;
    auStack_3bf8._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3be0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3bc8[0x18] = 0;
    local_3bc8._25_8_ = 0;
    local_3bc8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3bc8[0x10] = 0;
    local_3bc8._17_7_ = 0;
    local_3b60._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3b60._0_8_ = 0;
    local_3b60._8_8_ = (pointer)0x0;
    local_3b40._16_8_ = local_3b40;
    local_3b40._0_4_ = 0;
    local_3b40._8_8_ = 0;
    auStack_3ba0._16_4_ = 0;
    auStack_3ba0._20_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
    auStack_3ba0[0x18] = false;
    auStack_3ba0._25_3_ = 0;
    auStack_3ba0[0] = false;
    auStack_3ba0._1_3_ = 0;
    auStack_3ba0._4_4_ = (storage_t<unsigned_int>)0x0;
    auStack_3ba0._8_4_ = 0;
    auStack_3ba0._12_4_ = 0;
    auStack_3b78._8_4_ = 0;
    auStack_3b78._12_8_ = 0;
    auStack_3ba0._32_8_ = 0;
    auStack_3b78._0_4_ = 0;
    auStack_3b78._4_4_ = 0;
    local_3af0[0].data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_3b08._8_8_ = 0;
    auStack_3b08._16_8_ = 0;
    auStack_3b18._8_8_ = (pointer)0x0;
    auStack_3b08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_3b20 = (undefined1  [8])0x0;
    auStack_3b18._0_8_ = (storage_t<double>)0x0;
    local_41e8._464_8_ = (_Base_ptr)(local_41e8 + 0x1c0);
    local_41e8._472_8_ = (_Base_ptr)(local_41e8 + 0x1c0);
    local_3fe0._0_8_ = local_4008._32_8_;
    local_3c78._24_8_ = local_3c78._16_8_;
    local_3c38._8_8_ = local_3c38._0_8_;
    local_3b40._24_8_ = local_3b40._16_8_;
    bVar4 = ReconstructPrim<tinyusdz::Model>(this,&spec,local_4d10,psmap,(Model *)local_49a8);
    if (!bVar4) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"ReconstructPrimFromTypeName",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4cf8,"():",3);
      poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4cf8,0x721);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4cf8,"Failed to reconstruct Prim ",0x1b);
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_4cf8,(typeName->_M_dataplus)._M_p,
                          typeName->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," elementName: ",0xe);
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,*(char **)local_4d30._16_8_,
                          (long)(((string *)(local_4d30._16_8_ + 8))->_M_dataplus)._M_p);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      ::std::__cxx11::stringbuf::str();
LAB_0017d694:
      PushError(this,(string *)&local_4d40);
      poVar9 = local_4d08;
      if ((GeomMesh *)local_4d40.dynamic != (GeomMesh *)local_4d30) {
        operator_delete(local_4d40.dynamic,(ulong)((long)(OpType *)local_4d30._0_8_ + 1));
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
      ::std::ios_base::~ios_base((ios_base *)(local_4cf8 + 0x70));
      poVar9->has_value_ = false;
      memset(&poVar9->contained,0,0x350);
      goto LAB_0017ddec;
    }
    PrimMetas::operator=((PrimMetas *)local_3f80,meta);
    uVar3 = local_4d30._16_8_;
    ::std::__cxx11::string::_M_assign((string *)local_3fd0);
    local_3f90._0_4_ = spec;
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(auStack_3b08 + 8),
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
    pvVar1 = primChildren;
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)auStack_3b18,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
    local_4d30._0_8_ = linb::any::vtable_for_type<tinyusdz::Model>()::table;
    pGVar6 = (GeomMesh *)operator_new(0xec0);
    Model::Model((Model *)pGVar6,(Model *)local_49a8);
    local_4d40.dynamic = pGVar6;
    Prim::Prim((Prim *)local_4cf8,(string *)uVar3,(Value *)&local_4d40);
    ::std::__cxx11::string::_M_assign(local_4a88);
    pPVar7 = Prim::metas((Prim *)local_4cf8);
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar7->primChildren,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
    poVar9 = local_4d08;
  }
  poVar9->has_value_ = true;
  Prim::Prim((Prim *)&poVar9->contained,(Prim *)local_4cf8);
  Prim::~Prim((Prim *)local_4cf8);
  if ((pointer)local_4d30._0_8_ != (pointer)0x0) {
    (**(code **)((long)&((string *)(local_4d30._0_8_ + 8))->field_2 + 8))(&local_4d40);
    local_4d30._0_8_ = (pointer)0x0;
  }
LAB_0017ddec:
  Model::~Model((Model *)local_49a8);
  return poVar9;
}

Assistant:

nonstd::optional<Prim> USDCReader::Impl::ReconstructPrimFromTypeName(
    const std::string &typeName, // TinyUSDZ's Prim type name
    const std::string &primTypeName, // USD's Prim typeName
    const std::string &prim_name,
    const crate::CrateReader::Node &node, const Specifier spec,
    const std::vector<value::token> &primChildren,
    const std::vector<value::token> &properties,
    const PathIndexToSpecIndexMap &psmap, const PrimMeta &meta, bool *is_unsupported_prim) {

  if (is_unsupported_prim) {
    (*is_unsupported_prim) = false; // init with false
  }


#define RECONSTRUCT_PRIM(__primty, __node_ty, __prim_name, __spec) \
  if (__node_ty == value::TypeTraits<__primty>::type_name()) {     \
    __primty typed_prim;                                           \
    if (!ReconstructPrim(__spec, node, psmap, &typed_prim)) {         \
      PUSH_ERROR("Failed to reconstruct Prim " << __node_ty << " elementName: " << __prim_name);      \
      return nonstd::nullopt;                                      \
    }                                                              \
    typed_prim.meta = meta;                                        \
    typed_prim.name = __prim_name;                                 \
    typed_prim.spec = __spec;                                      \
    typed_prim.propertyNames() = properties; \
    typed_prim.primChildrenNames() = primChildren; \
    value::Value primdata = typed_prim;                            \
    Prim prim(__prim_name, primdata);                            \
    prim.prim_type_name() = primTypeName; \
    /* also add primChildren to Prim */ \
    prim.metas().primChildren = primChildren; \
    return std::move(prim); \
  }